

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O0

void avlCheckNode(NodeAVL *nd,int *err)

{
  NodeAVL *in_RSI;
  uint *in_RDI;
  int *in_stack_ffffffffffffffe8;
  
  if (in_RDI != (uint *)0x0) {
    if (*(long *)(in_RDI + 8) != 0) {
      if (*(double *)(in_RDI + 2) <= *(double *)(*(long *)(in_RDI + 8) + 8) &&
          *(double *)(*(long *)(in_RDI + 8) + 8) != *(double *)(in_RDI + 2)) {
        printf("Nespravne poradi nd=%d nd->left=%d (%6.4f %6.4f)\n",*(undefined8 *)(in_RDI + 2),
               *(undefined8 *)(*(long *)(in_RDI + 8) + 8),(ulong)*in_RDI,
               (ulong)**(uint **)(in_RDI + 8));
        in_RSI->id = 1;
      }
      if (*(uint **)(*(long *)(in_RDI + 8) + 0x30) != in_RDI) {
        printf("Nespravny rodic u nd->left=%d (je %d ma byt %d)\n",(ulong)**(uint **)(in_RDI + 8),
               (ulong)**(uint **)(*(long *)(in_RDI + 8) + 0x30),(ulong)*in_RDI);
        in_RSI->id = 1;
      }
      avlCheckNode(in_RSI,in_stack_ffffffffffffffe8);
    }
    if (*(long *)(in_RDI + 10) != 0) {
      if (*(double *)(*(long *)(in_RDI + 10) + 8) < *(double *)(in_RDI + 2)) {
        printf("Nespravne poradi nd=%d nd->right=%d (%6.4f %6.4f)\n",*(undefined8 *)(in_RDI + 2),
               *(undefined8 *)(*(long *)(in_RDI + 10) + 8),(ulong)*in_RDI,
               (ulong)**(uint **)(in_RDI + 10));
        in_RSI->id = 1;
      }
      if (*(uint **)(*(long *)(in_RDI + 10) + 0x30) != in_RDI) {
        printf("Nespravny rodic u nd->right=%d (je %d ma byt %d)\n",(ulong)**(uint **)(in_RDI + 10),
               (ulong)**(uint **)(*(long *)(in_RDI + 10) + 0x30),(ulong)*in_RDI);
        in_RSI->id = 1;
      }
      avlCheckNode(in_RSI,in_stack_ffffffffffffffe8);
    }
  }
  return;
}

Assistant:

static
void avlCheckNode( NodeAVL *nd, int *err ){
    if ( !nd ) return;
    if ( nd->left ){
        if ( nd->left->key > nd->key ){
            printf( "Nespravne poradi nd=%d nd->left=%d (%6.4f %6.4f)\n", nd->id, nd->left->id, nd->key, nd->left->key );
            *err = 1;
        }
        if ( nd->left->parent != nd ){
            printf( "Nespravny rodic u nd->left=%d (je %d ma byt %d)\n", nd->left->id, nd->left->parent->id, nd->id );
            *err = 1; }
        avlCheckNode( nd->left, err );
    }

    if ( nd->right ){
        if ( nd->right->key < nd->key ){
            printf( "Nespravne poradi nd=%d nd->right=%d (%6.4f %6.4f)\n", nd->id, nd->right->id, nd->key, nd->right->key );
            *err = 1;
        }
        if ( nd->right->parent != nd ){
            printf( "Nespravny rodic u nd->right=%d (je %d ma byt %d)\n", nd->right->id, nd->right->parent->id, nd->id );
            *err = 1;
        }
        avlCheckNode( nd->right, err );
    }
}